

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O3

entry * __thiscall
libtorrent::create_torrent::generate(entry *__return_storage_ptr__,create_torrent *this)

{
  vector<aux::vector<sha256_hash,_piece_index_t::diff_type>,_file_index_t> *file_piece_hash;
  file_flags_t fVar1;
  uint uVar2;
  pointer pcVar3;
  pointer ppVar4;
  size_type sVar5;
  pointer pbVar6;
  pointer pcVar7;
  libtorrent *this_00;
  pointer pdVar8;
  pointer pdVar9;
  integer_type iVar10;
  vector<sha1_hash,_piece_index_t> piece_hash;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  char cVar14;
  byte bVar15;
  data_type dVar16;
  entry *peVar17;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar18;
  reference value;
  ulong uVar19;
  NodePtr commit_data;
  compact_rbtree_node<void_*> *pcVar20;
  entry *this_01;
  list_type *plVar21;
  entry *peVar22;
  pointer pcVar23;
  dictionary_type *pdVar24;
  node_ptr pcVar25;
  string_type *psVar26;
  char *pcVar27;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *url;
  pointer ppVar28;
  digest32<256L> *p;
  pointer pdVar29;
  int iVar30;
  sha256_hash *in_R8;
  ulong uVar31;
  int iVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url_1;
  node_ptr *ppcVar33;
  pointer pbVar34;
  long lVar35;
  pointer pdVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  span<const_char> str;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  span<const_char> str_00;
  string_view key_22;
  string_view key_23;
  string_view key_24;
  string_view key_25;
  span<const_char> str_01;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  pair<boost::intrusive::compact_rbtree_node<void_*>_*,_bool> pVar39;
  span<const_libtorrent::digest32<256L>_> leaves;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  string_view p_03;
  string_view p_04;
  string_view p_05;
  entry *dict;
  list_type node;
  list_type tier;
  insert_commit_data data;
  vector<sha256_hash,_file_index_t> fileroots;
  create_torrent *pcVar40;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  pointer in_stack_fffffffffffffd68;
  ulong local_290;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [32];
  entry *local_228;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_220;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_218;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [16];
  pointer local_1c8;
  string local_1b8;
  string local_198;
  ulong local_178;
  key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>_>_>
  local_170;
  string local_168;
  string_type local_148;
  string_type local_128;
  string_type local_108;
  string_type local_e8;
  string_type local_c8;
  string_type local_a8;
  string_type local_88;
  list_type local_68;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_48;
  
  if (((this->m_files).
       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->m_files).
       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (this->m_total_size == 0)) {
    local_278._0_4_ = 0xd3;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_278);
  }
  file_piece_hash = &this->m_file_piece_hash;
  bVar13 = anon_unknown_40::validate_v2_hashes(&this->m_files,file_piece_hash,this->m_piece_length);
  local_248[0x18] = bVar13;
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            (&local_48,
             &(this->m_piece_hash).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            );
  piece_hash.super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_7_ = in_stack_fffffffffffffd60;
  piece_hash.super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this;
  piece_hash.super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish._7_1_ = in_stack_fffffffffffffd67;
  piece_hash.super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd68;
  cVar14 = anon_unknown_40::validate_v1_hashes
                     ((anon_unknown_40 *)
                      local_48.
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,piece_hash,
                      (int64_t)local_48.
                               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,(int)this->m_total_size);
  if ((anon_unknown_40 *)
      local_48.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (anon_unknown_40 *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_248[0x18] == '\0' && cVar14 == '\0') {
    local_278._0_4_ = 0xaf;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_278);
  }
  entry::entry(__return_storage_ptr__);
  ppVar28 = (this->m_urls).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar28 !=
      (this->m_urls).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar3 = (ppVar28->first)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar3,pcVar3 + (ppVar28->first)._M_string_length);
    key._M_str = "announce";
    key._M_len = 8;
    peVar17 = entry::operator[](__return_storage_ptr__,key);
    entry::operator=(peVar17,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_00._M_str = "nodes";
    key_00._M_len = 5;
    peVar17 = entry::operator[](__return_storage_ptr__,key_00);
    pvVar18 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar17);
    ppVar28 = (this->m_nodes).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (this->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar28 != ppVar4) {
      do {
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_278,2,
                   (allocator_type *)local_258);
        pcVar3 = (ppVar28->first)._M_dataplus._M_p;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar3,pcVar3 + (ppVar28->first)._M_string_length);
        entry::operator=((entry *)local_278._0_8_,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        entry::operator=((entry *)(local_278._0_8_ + 0x28),(long)ppVar28->second);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                  (pvVar18,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           local_278);
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_278);
        ppVar28 = ppVar28 + 1;
      } while (ppVar28 != ppVar4);
    }
  }
  ppVar28 = (this->m_urls).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->m_urls).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)ppVar4 - (long)ppVar28 >> 3) * -0x3333333333333333)) {
    local_278 = (undefined1  [16])0x0;
    local_268._0_8_ = 0;
    local_248._0_8_ = 0;
    local_258._0_8_ = 0;
    local_258._8_8_ = (char *)0x0;
    if (ppVar28 != ppVar4) {
      iVar32 = ppVar28->second;
      do {
        iVar30 = ppVar28->second;
        if (iVar30 != iVar32) {
          ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
          emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                    ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_278,
                     (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_258);
          uVar11 = local_258._0_8_;
          uVar12 = local_258._8_8_;
          peVar17 = (entry *)local_258._0_8_;
          iVar32 = iVar30;
          if (local_258._8_8_ != local_258._0_8_) {
            do {
              entry::~entry(peVar17);
              peVar17 = peVar17 + 1;
            } while (peVar17 != (entry *)uVar12);
            local_258._8_8_ = uVar11;
          }
        }
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_258,
                   &ppVar28->first);
        ppVar28 = ppVar28 + 1;
      } while (ppVar28 != ppVar4);
    }
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)local_278,
               (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_258);
    local_68.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
    local_68.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
    local_68.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_268._0_8_;
    local_278 = (undefined1  [16])0x0;
    local_268._0_8_ = 0;
    key_01._M_str = "announce-list";
    key_01._M_len = 0xd;
    peVar17 = entry::operator[](__return_storage_ptr__,key_01);
    entry::operator=(peVar17,&local_68);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&local_68);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_258);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_278);
  }
  sVar5 = (this->m_comment)._M_string_length;
  if (sVar5 != 0) {
    pcVar3 = (this->m_comment)._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_c8,pcVar3,pcVar3 + sVar5);
    key_02._M_str = "comment";
    key_02._M_len = 7;
    peVar17 = entry::operator[](__return_storage_ptr__,key_02);
    entry::operator=(peVar17,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  lVar35 = this->m_creation_date;
  if (lVar35 != 0) {
    key_03._M_str = "creation date";
    key_03._M_len = 0xd;
    peVar17 = entry::operator[](__return_storage_ptr__,key_03);
    entry::operator=(peVar17,lVar35);
  }
  sVar5 = (this->m_created_by)._M_string_length;
  if (sVar5 != 0) {
    pcVar3 = (this->m_created_by)._M_dataplus._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_e8,pcVar3,pcVar3 + sVar5);
    key_04._M_str = "created by";
    key_04._M_len = 10;
    peVar17 = entry::operator[](__return_storage_ptr__,key_04);
    entry::operator=(peVar17,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar34 = (this->m_url_seeds).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->m_url_seeds).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar34 != pbVar6) {
    if ((long)pbVar6 - (long)pbVar34 == 0x20) {
      pcVar3 = (pbVar34->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar3,pcVar3 + pbVar34->_M_string_length);
      key_05._M_str = "url-list";
      key_05._M_len = 8;
      peVar17 = entry::operator[](__return_storage_ptr__,key_05);
      entry::operator=(peVar17,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      key_08._M_str = "url-list";
      key_08._M_len = 8;
      peVar17 = entry::operator[](__return_storage_ptr__,key_08);
      pbVar6 = (this->m_url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar34 = (this->m_url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar34 != pbVar6;
          pbVar34 = pbVar34 + 1) {
        pvVar18 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar17);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar18,pbVar34);
      }
    }
  }
  local_1d8 = (undefined1  [16])0x0;
  local_1c8 = (pointer)0x0;
  pcVar40 = this;
  if (local_248[0x18] != '\0') {
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
              ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> *)
               local_1d8,
               ((long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3);
    iVar32 = this->m_piece_length;
    iVar30 = iVar32 + 0x3fff;
    if (-1 < iVar32) {
      iVar30 = iVar32;
    }
    merkle_pad((sha256_hash *)local_278,iVar30 >> 0xe,1);
    key_06._M_str = "piece layers";
    key_06._M_len = 0xc;
    peVar17 = entry::operator[](__return_storage_ptr__,key_06);
    value = (reference)entry::dict_abi_cxx11_(peVar17);
    uVar19 = ((long)(pcVar40->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pcVar40->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    if ((int)uVar19 != 0) {
      ppcVar33 = &(value->super_type).super_type.super_compact_rbtree_node<void_*>.left_;
      uVar31 = 0;
      do {
        pcVar23 = (pcVar40->m_files).
                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  .
                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((((file_flags_t *)((long)(pcVar23 + uVar31) + 0x28))->m_val & 1) == 0) &&
           (*(int64_t *)((long)(pcVar23 + uVar31) + 0x20) != 0)) {
          pcVar7 = (file_piece_hash->
                   super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ).
                   super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this_00 = *(libtorrent **)
                     &pcVar7[uVar31].
                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ;
          leaves.m_ptr = (digest32<256L> *)
                         ((long)*(pointer *)
                                 ((long)&pcVar7[uVar31].
                                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                         .
                                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 + 8) - (long)this_00 >> 5);
          leaves.m_len = (difference_type)local_278;
          merkle_root((sha256_hash *)local_258,this_00,leaves,in_R8);
          *(undefined8 *)((((pointer)(local_1d8._0_8_ + uVar31 * 0x20))->m_number)._M_elems + 4) =
               local_248._0_8_;
          *(undefined8 *)((((pointer)(local_1d8._0_8_ + uVar31 * 0x20))->m_number)._M_elems + 6) =
               local_248._8_8_;
          *(undefined8 *)(((pointer)(local_1d8._0_8_ + uVar31 * 0x20))->m_number)._M_elems =
               local_258._0_8_;
          *(undefined8 *)((((pointer)(local_1d8._0_8_ + uVar31 * 0x20))->m_number)._M_elems + 2) =
               local_258._8_8_;
          pcVar7 = (file_piece_hash->
                   super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ).
                   super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (0x20 < (ulong)((long)*(pointer *)
                                    ((long)&pcVar7[uVar31].
                                            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                            .
                                            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    + 8) -
                            *(long *)&pcVar7[uVar31].
                                      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                      .
                                      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            )) {
            local_258._0_8_ = local_248;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_258,(pointer)(local_1d8._0_8_ + uVar31 * 0x20),
                       (pointer)(local_1d8._0_8_ + uVar31 * 0x20) + 1);
            local_218.first._M_len = local_218.first._M_len & 0xffffffffffffff00;
            local_218.first._M_str = (char *)0x0;
            in_R8 = (sha256_hash *)0x0;
            local_220.traits_ =
                 (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
                  *)ppcVar33;
            local_1f8._0_8_ = ppcVar33;
            pVar39 = boost::intrusive::
                     bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
                     insert_unique_check<std::__cxx11::string,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                               ((const_node_ptr *)local_1f8,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_258,&local_220,(insert_commit_data *)&local_218,(size_t *)0x0
                               );
            pcVar20 = pVar39.first;
            if (((undefined1  [16])pVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              commit_data = boost::container::dtl::
                            node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                            ::create_node<boost::container::try_emplace_t,std::__cxx11::string>
                                      ((node_alloc_holder<boost::container::new_allocator<std::pair<std::__cxx11::string_const,libtorrent::entry>>,boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,void,boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::tree_value_compare<std::pair<std::__cxx11::string_const,libtorrent::entry>*,libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>,bool,false>,bool>,unsigned_long,true,void>>
                                        *)value,(try_emplace_t *)&local_220,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_258);
              boost::intrusive::
              bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
              ::insert_unique_commit
                        ((bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                          *)local_1f8,value,(insert_commit_data *)commit_data);
              pcVar20 = (compact_rbtree_node<void_*> *)local_1f8._0_8_;
            }
            if (pcVar20 == (compact_rbtree_node<void_*> *)0x0) {
              __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                            "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const std::basic_string<char>, libtorrent::entry>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                           );
            }
            psVar26 = entry::string_abi_cxx11_((entry *)&pcVar20[2].left_);
            if ((pointer)local_258._0_8_ != (pointer)local_248) {
              operator_delete((void *)local_258._0_8_,(ulong)(local_248._0_8_ + 1));
            }
            psVar26->_M_string_length = 0;
            *(psVar26->_M_dataplus)._M_p = '\0';
            ::std::__cxx11::string::reserve((ulong)psVar26);
            pcVar7 = (file_piece_hash->
                     super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                     ).
                     super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar8 = *(pointer *)
                      ((long)&pcVar7[uVar31].
                              super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              .
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                      + 8);
            for (pdVar29 = *(pointer *)
                            &pcVar7[uVar31].
                             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                ; pdVar29 != pdVar8; pdVar29 = pdVar29 + 1) {
              ::std::__cxx11::string::append((char *)psVar26,(ulong)pdVar29);
            }
          }
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != (uVar19 & 0xffffffff));
    }
  }
  key_07._M_str = "info";
  key_07._M_len = 4;
  this_01 = entry::operator[](__return_storage_ptr__,key_07);
  peVar17 = &pcVar40->m_info_dict;
  dVar16 = entry::type(peVar17);
  if ((dVar16 == dictionary_t) || (dVar16 = entry::type(peVar17), dVar16 == preformatted_t)) {
    entry::operator=(this_01,peVar17);
  }
  else {
    if ((pcVar40->m_collections).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar40->m_collections).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key_09._M_str = "collections";
      key_09._M_len = 0xb;
      peVar17 = entry::operator[](this_01,key_09);
      pbVar6 = (pcVar40->m_collections).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar34 = (pcVar40->m_collections).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar34 != pbVar6;
          pbVar34 = pbVar34 + 1) {
        pvVar18 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar17);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar18,pbVar34);
      }
    }
    if ((pcVar40->m_similar).
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar40->m_similar).
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key_10._M_str = "similar";
      key_10._M_len = 7;
      peVar17 = entry::operator[](this_01,key_10);
      pdVar9 = (pcVar40->m_similar).
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar36 = (pcVar40->m_similar).
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar36 != pdVar9;
          pdVar36 = pdVar36 + 1) {
        pvVar18 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar17);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<libtorrent::digest32<160l>const&>(pvVar18,pdVar36);
      }
    }
    pcVar3 = (pcVar40->m_name)._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar3,pcVar3 + (pcVar40->m_name)._M_string_length);
    key_11._M_str = "name";
    key_11._M_len = 4;
    peVar17 = entry::operator[](this_01,key_11);
    entry::operator=(peVar17,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    sVar5 = (pcVar40->m_root_cert)._M_string_length;
    if (sVar5 != 0) {
      pcVar3 = (pcVar40->m_root_cert)._M_dataplus._M_p;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_148,pcVar3,pcVar3 + sVar5);
      key_12._M_str = "ssl-cert";
      key_12._M_len = 8;
      peVar17 = entry::operator[](this_01,key_12);
      entry::operator=(peVar17,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pcVar40->field_0x258 & 2) != 0) {
      key_13._M_str = "private";
      key_13._M_len = 7;
      peVar17 = entry::operator[](this_01,key_13);
      entry::operator=(peVar17,1);
    }
    if (cVar14 != '\0') {
      if ((pcVar40->field_0x258 & 1) == 0) {
        pcVar23 = (pcVar40->m_files).
                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  .
                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((pcVar40->field_0x258 & 4) != 0) && (lVar35 = pcVar23->mtime, lVar35 != 0)) {
          key_19._M_str = "mtime";
          key_19._M_len = 5;
          peVar17 = entry::operator[](this_01,key_19);
          entry::operator=(peVar17,lVar35);
        }
        iVar10 = pcVar23->size;
        key_20._M_str = "length";
        key_20._M_len = 6;
        peVar17 = entry::operator[](this_01,key_20);
        entry::operator=(peVar17,iVar10);
        fVar1.m_val = (pcVar23->flags).m_val;
        anon_unknown_40::add_file_attrs(this_01,fVar1,(bool)((pcVar40->field_0x258 & 8) >> 3));
        if ((fVar1.m_val & pcVar40->field_0x258 & 8) == 8) {
          lVar35 = *(long *)&(pcVar23->symlink)._M_dataplus;
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_168,lVar35,
                     *(size_type *)((long)&pcVar23->symlink + 8) + lVar35);
          anon_unknown_40::add_symlink_path(this_01,&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
        }
        pdVar36 = (pcVar40->m_filehashes).
                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pdVar36 !=
            (pcVar40->m_filehashes).
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          key_21._M_str = "sha1";
          key_21._M_len = 4;
          peVar17 = entry::operator[](this_01,key_21);
          str_00.m_len = 0x14;
          str_00.m_ptr = (char *)pdVar36;
          entry::operator=(peVar17,str_00);
        }
      }
      else {
        key_14._M_str = "files";
        key_14._M_len = 5;
        local_228 = entry::operator[](this_01,key_14);
        uVar19 = ((long)(pcVar40->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pcVar40->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
        if ((int)uVar19 != 0) {
          local_178 = uVar19 & 0xffffffff;
          local_290 = 0;
          do {
            plVar21 = entry::list(local_228);
            ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                      (plVar21);
            plVar21 = entry::list(local_228);
            peVar17 = (plVar21->
                      super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                      _M_impl.super__Vector_impl_data._M_finish + -1;
            pcVar23 = (pcVar40->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (((pcVar40->field_0x258 & 4) != 0) &&
               (lVar35 = *(time_t *)((long)(pcVar23 + local_290) + 0x30), lVar35 != 0)) {
              key_15._M_str = "mtime";
              key_15._M_len = 5;
              peVar22 = entry::operator[](peVar17,key_15);
              entry::operator=(peVar22,lVar35);
              pcVar23 = (pcVar40->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            iVar10 = *(int64_t *)((long)(pcVar23 + local_290) + 0x20);
            key_16._M_str = "length";
            key_16._M_len = 6;
            peVar22 = entry::operator[](peVar17,key_16);
            entry::operator=(peVar22,iVar10);
            key_17._M_str = "path";
            key_17._M_len = 4;
            peVar22 = entry::operator[](peVar17,key_17);
            pcVar23 = (pcVar40->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pcVar27 = local_268;
            local_278._0_8_ = pcVar27;
            lVar35 = *(long *)&pcVar23[local_290].filename;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,lVar35,
                       *(size_type *)((long)(pcVar23 + local_290) + 8) + lVar35);
            p_00._M_str = pcVar27;
            p_00._M_len = local_278._0_8_;
            lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)local_258,(libtorrent *)local_278._8_8_,p_00);
            p_01._M_str = pcVar27;
            p_01._M_len = local_248._8_8_;
            lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)local_258,(libtorrent *)local_248._0_8_,p_01);
            while ((pointer)local_258._0_8_ != (pointer)0x0) {
              pvVar18 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                        entry::list(peVar22);
              ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                        (pvVar18,(basic_string_view<char,_std::char_traits<char>_> *)local_258);
              p_02._M_str = pcVar27;
              p_02._M_len = local_248._8_8_;
              lsplit_path(&local_218,(libtorrent *)local_248._0_8_,p_02);
              local_258._8_8_ = local_218.first._M_str;
              local_258._0_8_ = local_218.first._M_len;
              local_248._0_8_ = local_218.second._M_len;
              local_248._8_8_ = local_218.second._M_str;
            }
            if ((pointer)local_278._0_8_ != (pointer)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
            fVar1.m_val = ((file_flags_t *)
                          ((long)((pcVar40->m_files).
                                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  .
                                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_290) + 0x28))->
                          m_val;
            anon_unknown_40::add_file_attrs(peVar17,fVar1,(bool)((pcVar40->field_0x258 & 8) >> 3));
            if (((pcVar40->field_0x258 & 8) != 0) && ((fVar1.m_val & 8) != 0)) {
              pcVar23 = (pcVar40->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              lVar35 = *(long *)((long)(pcVar23 + local_290) + 0x38);
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_198,lVar35,
                         *(size_type *)((long)(pcVar23 + local_290) + 0x40) + lVar35);
              anon_unknown_40::add_symlink_path(peVar17,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p,
                                local_198.field_2._M_allocated_capacity + 1);
              }
            }
            pdVar36 = (pcVar40->m_filehashes).
                      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pdVar36 !=
                (pcVar40->m_filehashes).
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_278 = (undefined1  [16])0x0;
              local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
              pdVar9 = pdVar36 + local_290;
              uVar2 = pdVar36[local_290].m_number._M_elems[4];
              auVar38[0] = -((char)uVar2 == '\0');
              auVar38[1] = -((char)(uVar2 >> 8) == '\0');
              auVar38[2] = -((char)(uVar2 >> 0x10) == '\0');
              auVar38[3] = -((char)(uVar2 >> 0x18) == '\0');
              auVar38[4] = 0xff;
              auVar38[5] = 0xff;
              auVar38[6] = 0xff;
              auVar38[7] = 0xff;
              auVar38[8] = 0xff;
              auVar38[9] = 0xff;
              auVar38[10] = 0xff;
              auVar38[0xb] = 0xff;
              auVar38[0xc] = 0xff;
              auVar38[0xd] = 0xff;
              auVar38[0xe] = 0xff;
              auVar38[0xf] = 0xff;
              auVar37[0] = -((char)(pdVar9->m_number)._M_elems[0] == '\0');
              auVar37[1] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 1) == '\0');
              auVar37[2] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 2) == '\0');
              auVar37[3] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 3) == '\0');
              auVar37[4] = -((char)(pdVar9->m_number)._M_elems[1] == '\0');
              auVar37[5] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 5) == '\0');
              auVar37[6] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 6) == '\0');
              auVar37[7] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 7) == '\0');
              auVar37[8] = -((char)(pdVar9->m_number)._M_elems[2] == '\0');
              auVar37[9] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 9) == '\0');
              auVar37[10] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 10) == '\0');
              auVar37[0xb] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 0xb) == '\0');
              auVar37[0xc] = -((char)(pdVar9->m_number)._M_elems[3] == '\0');
              auVar37[0xd] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 0xd) == '\0');
              auVar37[0xe] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 0xe) == '\0');
              auVar37[0xf] = -(*(char *)((long)(pdVar9->m_number)._M_elems + 0xf) == '\0');
              auVar37 = auVar37 & auVar38;
              if ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) != 0xffff) {
                key_18._M_str = "sha1";
                key_18._M_len = 4;
                peVar17 = entry::operator[](peVar17,key_18);
                str.m_len = 0x14;
                str.m_ptr = (char *)(pdVar36 + local_290);
                entry::operator=(peVar17,str);
              }
            }
            local_290 = local_290 + 1;
          } while (local_290 != local_178);
        }
      }
    }
    if (local_248[0x18] != '\0') {
      key_22._M_str = "file tree";
      key_22._M_len = 9;
      local_228 = entry::operator[](this_01,key_22);
      uVar19 = ((long)(pcVar40->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pcVar40->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      if ((int)uVar19 != 0) {
        local_248._24_8_ = uVar19 & 0xffffffff;
        uVar19 = 0;
        do {
          pcVar23 = (pcVar40->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          fVar1.m_val = ((file_flags_t *)((long)(pcVar23 + uVar19) + 0x28))->m_val;
          if ((fVar1.m_val & 1) == 0) {
            pcVar23 = pcVar23 + uVar19;
            pcVar27 = local_268;
            local_278._0_8_ = pcVar27;
            lVar35 = *(long *)&pcVar23->filename;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,lVar35,
                       *(size_type *)((long)&pcVar23->filename + 8) + lVar35);
            if ((pcVar40->field_0x258 & 1) == 0) {
              local_258._8_8_ = local_278._0_8_;
              local_258._0_8_ = local_278._8_8_;
              local_248._0_8_ = local_278._8_8_;
              local_248._8_8_ = local_278._0_8_;
            }
            else {
              p_03._M_str = pcVar27;
              p_03._M_len = local_278._0_8_;
              lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)local_258,(libtorrent *)local_278._8_8_,p_03);
            }
            p_04._M_str = pcVar27;
            p_04._M_len = local_248._8_8_;
            lsplit_path(&local_218,(libtorrent *)local_248._0_8_,p_04);
            peVar17 = local_228;
            while ((compact_rbtree_node<void_*> *)local_218.first._M_len !=
                   (compact_rbtree_node<void_*> *)0x0) {
              key_23._M_str = local_218.first._M_str;
              key_23._M_len = local_218.first._M_len;
              peVar17 = entry::operator[](peVar17,key_23);
              pdVar24 = entry::dict_abi_cxx11_(peVar17);
              local_1f8._8_8_ = (node_ptr)0x0;
              local_1f8[0x10] = '\0';
              local_220.traits_ =
                   (bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>
                    *)&(pdVar24->
                       super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                       ).
                       super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                       .m_icont.
                       super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
              ;
              local_1f8._0_8_ = (compact_rbtree_node<void_*> *)(local_1f8 + 0x10);
              local_170.traits_ = local_220.traits_;
              pcVar25 = boost::intrusive::
                        bstree_algorithms<boost::intrusive::rbtree_node_traits<void*,true>>::
                        find<std::__cxx11::string,boost::intrusive::detail::key_nodeptr_comp<boost::container::dtl::key_node_compare<libtorrent::aux::strview_less,boost::container::dtl::select1st<std::__cxx11::string_const>>,boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,boost::move_detail::identity<boost::container::dtl::tree_node<std::pair<std::__cxx11::string_const,libtorrent::entry>,void*,(boost::container::tree_type_enum)0,true>>>>
                                  ((const_node_ptr *)&local_220,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1f8,&local_170);
              pdVar24 = entry::dict_abi_cxx11_(peVar17);
              if ((compact_rbtree_node<void_*> *)local_1f8._0_8_ !=
                  (compact_rbtree_node<void_*> *)(local_1f8 + 0x10)) {
                operator_delete((void *)local_1f8._0_8_,
                                CONCAT71(local_1f8._17_7_,local_1f8[0x10]) + 1);
              }
              if (pcVar25 !=
                  (node_ptr)
                  &(pdVar24->
                   super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                   ).
                   super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                   .m_icont.
                   super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                   .
                   super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                 ) {
                local_1f8._0_4_ = 0xd5;
                aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                          ((error_code_enum *)local_1f8);
              }
              p_05._M_str = pcVar27;
              p_05._M_len = (size_t)local_218.second._M_str;
              lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)local_1f8,(libtorrent *)local_218.second._M_len,p_05);
              local_218.first._M_str = (char *)local_1f8._8_8_;
              local_218.second._M_len = CONCAT71(local_1f8._17_7_,local_1f8[0x10]);
              local_218.second._M_str = (char *)local_1f8._24_8_;
              local_218.first._M_len = local_1f8._0_8_;
            }
            if ((pointer)local_278._0_8_ != (pointer)local_268) {
              operator_delete((void *)local_278._0_8_,(ulong)(local_268._0_8_ + 1));
            }
            pdVar24 = entry::dict_abi_cxx11_(peVar17);
            if (*(long *)&(pdVar24->
                          super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                          ).
                          super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                          .m_icont.
                          super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                          .
                          super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                          .
                          super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                          .super_size_holder<true,_unsigned_long,_void> != 0) {
              local_278._0_4_ = 0xd5;
              aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                        ((error_code_enum *)local_278);
            }
            peVar17 = entry::operator[](peVar17,(string_view)ZEXT816(0));
            bVar15 = pcVar40->field_0x258;
            if (((bVar15 & 4) != 0) &&
               (lVar35 = *(time_t *)
                          ((long)((pcVar40->m_files).
                                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  .
                                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar19) + 0x30),
               lVar35 != 0)) {
              key_24._M_str = "mtime";
              key_24._M_len = 5;
              peVar22 = entry::operator[](peVar17,key_24);
              entry::operator=(peVar22,lVar35);
              bVar15 = pcVar40->field_0x258;
            }
            anon_unknown_40::add_file_attrs(peVar17,fVar1,(bool)((bVar15 & 8) >> 3));
            pcVar23 = (pcVar40->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((fVar1.m_val & pcVar40->field_0x258 & 8) == 0) {
              lVar35 = *(int64_t *)((long)(pcVar23 + uVar19) + 0x20);
              if (0 < lVar35) {
                uVar11 = local_1d8._0_8_;
                key_25._M_str = "pieces root";
                key_25._M_len = 0xb;
                peVar22 = entry::operator[](peVar17,key_25);
                str_01.m_len = 0x20;
                str_01.m_ptr = (char *)(uVar11 + uVar19 * 0x20);
                entry::operator=(peVar22,str_01);
                lVar35 = *(int64_t *)
                          ((long)((pcVar40->m_files).
                                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  .
                                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar19) + 0x20);
              }
              key_26._M_str = "length";
              key_26._M_len = 6;
              peVar17 = entry::operator[](peVar17,key_26);
              entry::operator=(peVar17,lVar35);
            }
            else {
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,*(long *)((long)(pcVar23 + uVar19) + 0x38),
                         *(size_type *)((long)(pcVar23 + uVar19) + 0x40) +
                         *(long *)((long)(pcVar23 + uVar19) + 0x38));
              anon_unknown_40::add_symlink_path(peVar17,&local_1b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p,
                                local_1b8.field_2._M_allocated_capacity + 1);
              }
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != local_248._24_8_);
      }
      key_27._M_str = "meta version";
      key_27._M_len = 0xc;
      peVar17 = entry::operator[](this_01,key_27);
      entry::operator=(peVar17,2);
    }
    iVar32 = pcVar40->m_piece_length;
    key_28._M_str = "piece length";
    key_28._M_len = 0xc;
    peVar17 = entry::operator[](this_01,key_28);
    entry::operator=(peVar17,(long)iVar32);
    if (cVar14 != '\0') {
      key_29._M_str = "pieces";
      key_29._M_len = 6;
      peVar17 = entry::operator[](this_01,key_29);
      psVar26 = entry::string_abi_cxx11_(peVar17);
      pdVar9 = (pcVar40->m_piece_hash).
               super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               .
               super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar36 = (pcVar40->m_piece_hash).
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar36 != pdVar9;
          pdVar36 = pdVar36 + 1) {
        ::std::__cxx11::string::append((char *)psVar26,(ulong)pdVar36);
      }
    }
  }
  if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

entry create_torrent::generate() const
	{
		if (m_files.empty() || m_total_size == 0)
			aux::throw_ex<system_error>(errors::torrent_missing_file_tree);

		// if all v2 hashes are set correctly, generate the v2 parts of the
		// torrent
		bool const make_v2 = validate_v2_hashes(m_files, m_file_piece_hash, m_piece_length);
		bool const make_v1 = validate_v1_hashes(m_piece_hash, m_total_size, m_piece_length);

		// if neither v1 nor v2 hashes were set, we can't create a torrent
		if (!make_v1 && !make_v2)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		TORRENT_ASSERT(m_piece_length > 0);

		entry dict;

		if (!m_urls.empty()) dict["announce"] = m_urls.front().first;

		if (!m_nodes.empty())
		{
			entry& nodes = dict["nodes"];
			entry::list_type& nodes_list = nodes.list();
			for (auto const& n : m_nodes)
			{
				entry::list_type node(2);
				node[0] = n.first;
				node[1] = n.second;
				nodes_list.emplace_back(std::move(node));
			}
		}

		if (m_urls.size() > 1)
		{
			entry::list_type trackers;
			entry::list_type tier;
			int current_tier = m_urls.front().second;
			for (auto const& url : m_urls)
			{
				if (url.second != current_tier)
				{
					current_tier = url.second;
					trackers.emplace_back(std::move(tier));
					tier.clear();
				}
				tier.emplace_back(url.first);
			}
			trackers.emplace_back(std::move(tier));
			dict["announce-list"] = std::move(trackers);
		}

		if (!m_comment.empty())
			dict["comment"] = m_comment;

		if (m_creation_date != 0)
			dict["creation date"] = m_creation_date;

		if (!m_created_by.empty())
			dict["created by"] = m_created_by;

		if (!m_url_seeds.empty())
		{
			if (m_url_seeds.size() == 1)
			{
				dict["url-list"] = m_url_seeds.front();
			}
			else
			{
				entry& list = dict["url-list"];
				for (auto const& url : m_url_seeds)
				{
					list.list().emplace_back(url);
				}
			}
		}

		aux::vector<sha256_hash, file_index_t> fileroots;
		if (make_v2)
		{
			TORRENT_ASSERT(!m_file_piece_hash.empty());
			fileroots.resize(m_files.size());

			sha256_hash const pad_hash = merkle_pad(m_piece_length / default_block_size, 1);
			auto& file_pieces = dict["piece layers"].dict();

			for (file_index_t fi : file_range())
			{
				if (m_files[fi].flags & file_storage::flag_pad_file) continue;
				if (m_files[fi].size == 0) continue;

				fileroots[fi] = merkle_root(m_file_piece_hash[fi], pad_hash);

				// files that only have one piece store the piece hash as the
				// root, we don't need a pieces layer entry for such files
				if (m_file_piece_hash[fi].size() < 2) continue;
				auto& pieces = file_pieces[fileroots[fi].to_string()].string();
				pieces.clear();
				pieces.reserve(m_file_piece_hash[fi].size() * sha256_hash::size());
				for (auto const& p : m_file_piece_hash[fi])
					pieces.append(reinterpret_cast<const char*>(p.data()), p.size());
			}
		}

		entry& info = dict["info"];
#if TORRENT_ABI_VERSION < 4
		if (m_info_dict.type() == entry::dictionary_t
			|| m_info_dict.type() == entry::preformatted_t)
		{
			info = m_info_dict;
			return dict;
		}
#endif

		if (!m_collections.empty())
		{
			entry& list = info["collections"];
			for (auto const& c : m_collections)
			{
				list.list().emplace_back(c);
			}
		}

		if (!m_similar.empty())
		{
			entry& list = info["similar"];
			for (auto const& ih : m_similar)
			{
				list.list().emplace_back(ih);
			}
		}

		info["name"] = m_name;

		if (!m_root_cert.empty())
			info["ssl-cert"] = m_root_cert;

		if (m_private) info["private"] = 1;

		if (make_v1)
		{
			if (!m_multifile)
			{
				auto const& file = m_files.front();
				if (m_include_mtime && file.mtime)
					info["mtime"] = file.mtime;
				info["length"] = file.size;
				file_flags_t const flags = file.flags;
				add_file_attrs(info, flags, m_include_symlinks);
				if (m_include_symlinks
					&& (flags & file_storage::flag_symlink))
				{
					add_symlink_path(info, file.symlink);
				}
#if TORRENT_ABI_VERSION < 3
				if (!m_filehashes.empty())
				{
					info["sha1"] = m_filehashes.front();
				}
#endif
			}
			else
			{
				entry& files = info["files"];

				for (auto const i : file_range())
				{
					files.list().emplace_back();
					entry& file_e = files.list().back();
					if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;
					file_e["length"] = m_files[i].size;

					TORRENT_ASSERT(has_parent_path(m_files[i].filename));

					{
						entry& path_e = file_e["path"];

						std::string const p = m_files[i].filename;
						// deliberately skip the first path element, since that's the
						// "name" of the torrent already
						string_view path = lsplit_path(p).second;
						for (auto elems = lsplit_path(path); !elems.first.empty(); elems = lsplit_path(elems.second))
							path_e.list().emplace_back(elems.first);
					}

					file_flags_t const flags = m_files[i].flags;
					add_file_attrs(file_e, flags, m_include_symlinks);

					if (m_include_symlinks && (flags & file_storage::flag_symlink))
					{
						add_symlink_path(file_e, m_files[i].symlink);
					}
#if TORRENT_ABI_VERSION < 3
					if (!m_filehashes.empty() && m_filehashes[i] != sha1_hash())
					{
						file_e["sha1"] = m_filehashes[i];
					}
#endif
				}
			}
		}

		if (make_v2)
		{
			auto& tree = info["file tree"];

			for (file_index_t i : file_range())
			{
				file_flags_t const flags = m_files[i].flags;
				if (flags & file_storage::flag_pad_file) continue;

				entry* file_e_ptr = &tree;

				{
					std::string const file_path = m_files[i].filename;
					auto const split = m_multifile
						? lsplit_path(file_path)
						: std::pair<string_view, string_view>(file_path, file_path);
					TORRENT_ASSERT(split.first == m_name);

					for (auto e = lsplit_path(split.second);
						!e.first.empty();
						e = lsplit_path(e.second))
					{
						file_e_ptr = &(*file_e_ptr)[e.first];
						if (file_e_ptr->dict().find({}) != file_e_ptr->dict().end())
						{
							// path conflict
							// there is already a file with this name
							// refuse to generate a torrent with such a conflict
							aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
						}
					}
				}

				if (!file_e_ptr->dict().empty())
				{
					// path conflict
					// there is already a directory with this name
					// refuse to generate a torrent with such a conflict
					aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
				}

				entry& file_e = (*file_e_ptr)[{}];

				if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;

				add_file_attrs(file_e, flags, m_include_symlinks);

				if (m_include_symlinks && (flags & file_storage::flag_symlink))
				{
					add_symlink_path(file_e, m_files[i].symlink);
				}
				else
				{
					if (m_files[i].size > 0)
						file_e["pieces root"] = fileroots[i];
					file_e["length"] = m_files[i].size;
				}
			}
			info["meta version"] = 2;
		}

		info["piece length"] = m_piece_length;

		if (make_v1)
		{
			std::string& p = info["pieces"].string();

			for (sha1_hash const& h : m_piece_hash)
				p.append(h.data(), h.size());
		}

		return dict;
	}